

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O2

void handle_child(session_t *sess)

{
  char *str;
  char *left;
  code *pcVar1;
  long lVar2;
  int iVar3;
  ssize_t sVar4;
  long lVar5;
  
  ftp_relply(sess,0xdc,"(miniftpd 0.1)");
  str = sess->cmdline;
  left = sess->cmd;
LAB_001036c4:
  do {
    memset(str,0,0x820);
    start_cmdio_alarm();
    sVar4 = readline(sess->ctrl_fd,str,0x400);
    if ((int)sVar4 == 0) {
      exit(0);
    }
    if ((int)sVar4 == -1) {
      perror("readline");
      exit(1);
    }
    str_trim_crlf(str);
    str_split(str,left,sess->cmd_arg,' ');
    str_upper(left);
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      if (lVar5 + 0x10 == 0x2a0) {
        ftp_relply(sess,500,"Unknown command.");
        goto LAB_001036c4;
      }
      iVar3 = strcmp(*(char **)((long)&ctrl_cmds_map[0].cmd + lVar5),left);
      lVar2 = lVar5 + 0x10;
    } while (iVar3 != 0);
    pcVar1 = *(code **)((long)&ctrl_cmds_map[0].cmd_func + lVar5);
    if (pcVar1 == (code *)0x0) {
      ftp_relply(sess,0x1f6,"Unimplement command.");
    }
    else {
      (*pcVar1)();
    }
  } while( true );
}

Assistant:

void handle_child(session_t *sess) {
  ftp_relply(sess, FTP_GREET, "(miniftpd 0.1)");
  int ret;
  while (1) {
    memset(sess->cmdline, 0, MAX_COMMAND_LINE);
    memset(sess->cmd, 0, MAX_COMMAND);
    memset(sess->cmd_arg, 0, MAX_ARG);

    start_cmdio_alarm();

    ret = readline(sess->ctrl_fd, sess->cmdline, MAX_COMMAND_LINE);

    if (ret == -1)
      ERR_EXIT("readline");
    else if (ret == 0)
      exit(EXIT_SUCCESS);
    // 解析读取到的FTP命令与参数，处理FTP命令，然后发送给父进程
    //printf("%s", sess->cmdline);
    str_trim_crlf(sess->cmdline);
    //printf("%s\n", sess->cmdline);

    // 将命令与参数分割
    str_split(sess->cmdline, sess->cmd, sess->cmd_arg, ' ');
    //printf("%s %s\n",sess->cmd,sess->cmd_arg);
    // 将命令全部转化为大写
    str_upper(sess->cmd);

    int i;
    int map_size = sizeof(ctrl_cmds_map) / sizeof(ctrl_cmds_map[0]);
    for (i = 0; i < map_size; ++i) {
      if (strcmp(ctrl_cmds_map[i].cmd, sess->cmd) == 0) {
        if (ctrl_cmds_map[i].cmd_func != NULL) {
          ctrl_cmds_map[i].cmd_func(sess);
        } else {
          ftp_relply(sess, FTP_COMMANDNOTIMPL, "Unimplement command.");
        }
        break;
      }
    }
    if (i == map_size) {
      ftp_relply(sess, FTP_BADCMD, "Unknown command.");
    }
  }
}